

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SColor.h
# Opt level: O2

SColor __thiscall irr::video::SColor::getInterpolated(SColor *this,SColor *other,f32 d)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = 0.0;
  if (0.0 <= (float)d) {
    fVar6 = (float)d;
  }
  if (1.0 <= fVar6) {
    fVar6 = 1.0;
  }
  uVar1 = other->color;
  fVar7 = 1.0 - fVar6;
  uVar2 = this->color;
  fVar3 = floorf((float)(uVar1 >> 0x18) * fVar7 + (float)(uVar2 >> 0x18) * fVar6 + 0.5);
  fVar4 = floorf((float)(uVar1 >> 0x10 & 0xff) * fVar7 + (float)(uVar2 >> 0x10 & 0xff) * fVar6 + 0.5
                );
  fVar5 = floorf((float)(uVar1 >> 8 & 0xff) * fVar7 + (float)(uVar2 >> 8 & 0xff) * fVar6 + 0.5);
  fVar6 = floorf((float)(uVar1 & 0xff) * fVar7 + (float)(uVar2 & 0xff) * fVar6 + 0.5);
  return (SColor)((int)fVar6 & 0xffU |
                 ((int)fVar5 & 0xffU) << 8 | ((int)fVar4 & 0xffU) << 0x10 | (int)fVar3 << 0x18);
}

Assistant:

SColor getInterpolated(const SColor &other, f32 d) const
	{
		d = core::clamp(d, 0.f, 1.f);
		const f32 inv = 1.0f - d;
		return SColor((u32)core::round32(other.getAlpha() * inv + getAlpha() * d),
				(u32)core::round32(other.getRed() * inv + getRed() * d),
				(u32)core::round32(other.getGreen() * inv + getGreen() * d),
				(u32)core::round32(other.getBlue() * inv + getBlue() * d));
	}